

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O1

void secp256k1_testrand_bytes_test(uchar *bytes,size_t len)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  memset(bytes,0,len);
  if (len != 0) {
    uVar9 = 0;
    do {
      uVar6 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      uVar10 = secp256k1_test_state[1] ^ secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar3 = secp256k1_test_state[0] ^ uVar6;
      uVar7 = uVar6 << 0x2d | uVar6 >> 0x13;
      uVar6 = uVar7 + uVar3;
      uVar7 = uVar7 ^ uVar10;
      uVar5 = secp256k1_test_state[2] ^ secp256k1_test_state[0] ^ secp256k1_test_state[1] << 0x11 ^
              uVar3;
      uVar8 = uVar10 ^ uVar5;
      uVar4 = uVar3 ^ uVar7;
      uVar7 = uVar7 << 0x2d | uVar7 >> 0x13;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = ((uVar6 * 0x800000 | uVar6 >> 0x29) + uVar3 >> 0x3b) *
                     (((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                      secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                      secp256k1_test_state[0] >> 0x3a) + 0x10;
      iVar2 = SUB164(auVar1 * ZEXT816(0x842108421084211),8) + 1;
      uVar6 = uVar7 + uVar4;
      uVar3 = uVar5 ^ uVar10 << 0x11 ^ uVar4;
      secp256k1_test_state[1] = uVar3 ^ uVar8;
      secp256k1_test_state[2] = uVar3 ^ uVar8 << 0x11;
      do {
        bytes[uVar9 >> 3] =
             bytes[uVar9 >> 3] |
             (byte)((uVar6 * 0x800000 | uVar6 >> 0x29) + uVar4 >> 0x3f) << ((byte)uVar9 & 7);
        uVar9 = uVar9 + 1;
        if (iVar2 < 2) break;
        iVar2 = iVar2 + -1;
      } while (uVar9 < len << 3);
      uVar8 = uVar8 ^ uVar7;
      secp256k1_test_state[0] = uVar4 ^ uVar8;
      secp256k1_test_state[3] = uVar8 << 0x2d | uVar8 >> 0x13;
    } while (uVar9 < len << 3);
  }
  return;
}

Assistant:

static void secp256k1_testrand_bytes_test(unsigned char *bytes, size_t len) {
    size_t bits = 0;
    memset(bytes, 0, len);
    while (bits < len * 8) {
        int now;
        uint32_t val;
        now = 1 + (secp256k1_testrand_bits(6) * secp256k1_testrand_bits(5) + 16) / 31;
        val = secp256k1_testrand_bits(1);
        while (now > 0 && bits < len * 8) {
            bytes[bits / 8] |= val << (bits % 8);
            now--;
            bits++;
        }
    }
}